

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::tydra::Animation>::destruct_value
          (storage_t<tinyusdz::tydra::Animation> *this)

{
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
              *)(this + 0x90),*(_Link_type *)(this + 0xa0));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
              *)(this + 0x60),*(_Link_type *)(this + 0x70));
  if (*(storage_t<tinyusdz::tydra::Animation> **)(this + 0x40) != this + 0x50) {
    operator_delete(*(storage_t<tinyusdz::tydra::Animation> **)(this + 0x40),
                    *(long *)(this + 0x50) + 1);
  }
  if (*(storage_t<tinyusdz::tydra::Animation> **)(this + 0x20) != this + 0x30) {
    operator_delete(*(storage_t<tinyusdz::tydra::Animation> **)(this + 0x20),
                    *(long *)(this + 0x30) + 1);
  }
  if (*(storage_t<tinyusdz::tydra::Animation> **)this != this + 0x10) {
    operator_delete(*(storage_t<tinyusdz::tydra::Animation> **)this,*(long *)(this + 0x10) + 1);
    return;
  }
  return;
}

Assistant:

void destruct_value()
    {
        value_ptr()->~T();
    }